

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvref_common.c
# Opt level: O2

void av1_setup_motion_field(AV1_COMMON *cm)

{
  TPL_MV_REF *pTVar1;
  int iVar2;
  RefCntBuffer *pRVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  OrderHintInfo *oh;
  int ref_idx;
  int iVar8;
  long lVar9;
  int ref_order_hint [7];
  RefCntBuffer *ref_buf [7];
  
  if ((cm->seq_params->order_hint_info).enable_order_hint == 0) {
    return;
  }
  oh = &cm->seq_params->order_hint_info;
  pTVar1 = cm->tpl_mvs;
  uVar4 = ((cm->mi_params).mi_stride >> 1) * ((cm->mi_params).mi_rows + 0x20 >> 1);
  uVar7 = 0;
  uVar6 = (ulong)uVar4;
  if ((int)uVar4 < 1) {
    uVar6 = uVar7;
  }
  for (; uVar6 != uVar7; uVar7 = uVar7 + 1) {
    pTVar1[uVar7].mfmv0.as_int = 0x80008000;
    pTVar1[uVar7].ref_frame_offset = '\0';
  }
  uVar4 = cm->cur_frame->order_hint;
  for (lVar9 = 0; lVar9 != 7; lVar9 = lVar9 + 1) {
    pRVar3 = get_ref_frame_buf(cm,(char)lVar9 + '\x01');
    if (pRVar3 == (RefCntBuffer *)0x0) {
      uVar5 = 0;
    }
    else {
      uVar5 = pRVar3->order_hint;
    }
    ref_buf[lVar9] = pRVar3;
    ref_order_hint[lVar9] = uVar5;
  }
  if (ref_buf[0] == (RefCntBuffer *)0x0) {
    iVar8 = 2;
  }
  else if (ref_buf[0]->ref_order_hints[6] == ref_order_hint[3]) {
    iVar8 = 1;
  }
  else {
    iVar8 = 1;
    motion_field_projection(cm,'\x01',2);
  }
  iVar2 = get_relative_dist(oh,ref_order_hint[4],uVar4);
  if (0 < iVar2) {
    iVar2 = motion_field_projection(cm,'\x05',0);
    iVar8 = iVar8 - iVar2;
  }
  iVar2 = get_relative_dist(oh,ref_order_hint[5],uVar4);
  if (0 < iVar2) {
    iVar2 = motion_field_projection(cm,'\x06',0);
    iVar8 = iVar8 - iVar2;
  }
  iVar2 = get_relative_dist(oh,ref_order_hint[6],uVar4);
  if ((0 < iVar2) && (-1 < iVar8)) {
    iVar2 = motion_field_projection(cm,'\a',0);
    if (iVar2 == 0) goto LAB_0032fac0;
    iVar8 = iVar8 + -1;
  }
  if (iVar8 < 0) {
    return;
  }
LAB_0032fac0:
  motion_field_projection(cm,'\x02',2);
  return;
}

Assistant:

void av1_setup_motion_field(AV1_COMMON *cm) {
  const OrderHintInfo *const order_hint_info = &cm->seq_params->order_hint_info;

  if (!order_hint_info->enable_order_hint) return;

  TPL_MV_REF *tpl_mvs_base = cm->tpl_mvs;
  int size = ((cm->mi_params.mi_rows + MAX_MIB_SIZE) >> 1) *
             (cm->mi_params.mi_stride >> 1);
  for (int idx = 0; idx < size; ++idx) {
    tpl_mvs_base[idx].mfmv0.as_int = INVALID_MV;
    tpl_mvs_base[idx].ref_frame_offset = 0;
  }

  const int cur_order_hint = cm->cur_frame->order_hint;
  const RefCntBuffer *ref_buf[INTER_REFS_PER_FRAME];
  int ref_order_hint[INTER_REFS_PER_FRAME];

  for (int ref_frame = LAST_FRAME; ref_frame <= ALTREF_FRAME; ref_frame++) {
    const int ref_idx = ref_frame - LAST_FRAME;
    const RefCntBuffer *const buf = get_ref_frame_buf(cm, ref_frame);
    int order_hint = 0;

    if (buf != NULL) order_hint = buf->order_hint;

    ref_buf[ref_idx] = buf;
    ref_order_hint[ref_idx] = order_hint;
  }

  int ref_stamp = MFMV_STACK_SIZE - 1;

  if (ref_buf[LAST_FRAME - LAST_FRAME] != NULL) {
    const int alt_of_lst_order_hint =
        ref_buf[LAST_FRAME - LAST_FRAME]
            ->ref_order_hints[ALTREF_FRAME - LAST_FRAME];

    const int is_lst_overlay =
        (alt_of_lst_order_hint == ref_order_hint[GOLDEN_FRAME - LAST_FRAME]);
    if (!is_lst_overlay) motion_field_projection(cm, LAST_FRAME, 2);
    --ref_stamp;
  }

  if (get_relative_dist(order_hint_info,
                        ref_order_hint[BWDREF_FRAME - LAST_FRAME],
                        cur_order_hint) > 0) {
    if (motion_field_projection(cm, BWDREF_FRAME, 0)) --ref_stamp;
  }

  if (get_relative_dist(order_hint_info,
                        ref_order_hint[ALTREF2_FRAME - LAST_FRAME],
                        cur_order_hint) > 0) {
    if (motion_field_projection(cm, ALTREF2_FRAME, 0)) --ref_stamp;
  }

  if (get_relative_dist(order_hint_info,
                        ref_order_hint[ALTREF_FRAME - LAST_FRAME],
                        cur_order_hint) > 0 &&
      ref_stamp >= 0)
    if (motion_field_projection(cm, ALTREF_FRAME, 0)) --ref_stamp;

  if (ref_stamp >= 0) motion_field_projection(cm, LAST2_FRAME, 2);
}